

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeInterface.cpp
# Opt level: O0

bool Rml::FreeType::Initialise(void)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FT_Error result;
  
  if ((ft_library != 0) &&
     (bVar2 = Assert("RMLUI_ASSERT(!ft_library)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/FontEngineDefault/FreeTypeInterface.cpp"
                     ,0x3b), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uVar3 = FT_Init_FreeType(&ft_library);
  if (uVar3 != 0) {
    Log::Message(LT_ERROR,"Failed to initialise FreeType, error %d.",(ulong)uVar3);
    Shutdown();
  }
  return uVar3 == 0;
}

Assistant:

bool FreeType::Initialise()
{
	RMLUI_ASSERT(!ft_library);

	FT_Error result = FT_Init_FreeType(&ft_library);
	if (result != 0)
	{
		Log::Message(Log::LT_ERROR, "Failed to initialise FreeType, error %d.", result);
		Shutdown();
		return false;
	}

	return true;
}